

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

int x86MOV(uchar *stream,x86Size size,x86Reg index,int multiplier,x86Reg base,int shift,int num)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uchar *puVar4;
  uchar *puVar5;
  uchar *start;
  int shift_local;
  x86Reg base_local;
  int multiplier_local;
  x86Reg index_local;
  x86Size size_local;
  uchar *stream_local;
  
  iVar1 = (int)stream;
  if (size == sBYTE) {
    if ((char)num != num) {
      __assert_fail("(char)(num) == num",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                    ,0x369,"int x86MOV(unsigned char *, x86Size, x86Reg, int, x86Reg, int, int)");
    }
    uVar2 = encodeRex(stream,false,rNONE,index,base);
    puVar4 = stream + uVar2;
    puVar5 = puVar4 + 1;
    *puVar4 = 0xc6;
    uVar2 = encodeAddress(puVar5,index,multiplier,base,shift,0);
    uVar3 = encodeImmByte(puVar5 + uVar2,(char)num);
    stream_local._4_4_ = ((int)(puVar5 + uVar2) + uVar3) - iVar1;
  }
  else if (size == sWORD) {
    if ((short)num != num) {
      __assert_fail("(short int)(num) == num",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                    ,0x374,"int x86MOV(unsigned char *, x86Size, x86Reg, int, x86Reg, int, int)");
    }
    puVar4 = stream + 1;
    *stream = 'f';
    uVar2 = encodeRex(puVar4,false,rNONE,index,base);
    puVar4 = puVar4 + uVar2;
    puVar5 = puVar4 + 1;
    *puVar4 = 199;
    uVar2 = encodeAddress(puVar5,index,multiplier,base,shift,0);
    uVar3 = encodeImmWord(puVar5 + uVar2,(short)num);
    stream_local._4_4_ = ((int)(puVar5 + uVar2) + uVar3) - iVar1;
  }
  else {
    uVar2 = encodeRex(stream,size == sQWORD,rNONE,index,base);
    puVar4 = stream + uVar2;
    puVar5 = puVar4 + 1;
    *puVar4 = 199;
    uVar2 = encodeAddress(puVar5,index,multiplier,base,shift,0);
    uVar3 = encodeImmDword(puVar5 + uVar2,num);
    stream_local._4_4_ = ((int)(puVar5 + uVar2) + uVar3) - iVar1;
  }
  return stream_local._4_4_;
}

Assistant:

int x86MOV(unsigned char *stream, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift, int num)
{
	unsigned char *start = stream;

	if(size == sBYTE)
	{
		assert((char)(num) == num);

		stream += encodeRex(stream, false, rNONE, index, base);
		*stream++ = 0xc6;
		stream += encodeAddress(stream, index, multiplier, base, shift, 0);
		stream += encodeImmByte(stream, (char)num);

		return int(stream - start);
	}
	else if(size == sWORD)
	{
		assert((short int)(num) == num);

		*stream++ = 0x66;	// switch to word
		stream += encodeRex(stream, false, rNONE, index, base);
		*stream++ = 0xc7;

		stream += encodeAddress(stream, index, multiplier, base, shift, 0);
		stream += encodeImmWord(stream, (short)num);

		return int(stream - start);
	}

	stream += encodeRex(stream, size == sQWORD, rNONE, index, base);
	*stream++ = 0xc7;
	stream += encodeAddress(stream, index, multiplier, base, shift, 0);
	stream += encodeImmDword(stream, num);

	return int(stream - start);
}